

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

bool slang::ast::builtins::ArrayQueryFunction::checkDim
               (ASTContext *context,Args *args,int32_t *resultIndex)

{
  SourceRange range;
  SourceRange sourceRange;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int *piVar4;
  Type *pTVar5;
  SourceLocation SVar6;
  Diagnostic *this;
  int *in_RDX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RSI;
  SourceLocation in_RDI;
  int32_t i;
  Type *type;
  optional<int> index;
  anon_class_24_3_8c0f11e8 error;
  ConstantValue iv;
  Expression *in_stack_00000290;
  ASTContext *in_stack_00000298;
  Type *in_stack_fffffffffffffee8;
  Diagnostic *in_stack_fffffffffffffef0;
  Type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  Type *in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  int iVar7;
  DiagCode code;
  int local_84;
  bool local_1;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RSI,1);
  ASTContext::tryEval(in_stack_00000298,in_stack_00000290);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x99a442);
  if (bVar1) {
    slang::ConstantValue::integer((ConstantValue *)0x99a4c5);
    SVInt::as<int>((SVInt *)CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,
                                              CONCAT15(in_stack_ffffffffffffff0d,
                                                       CONCAT14(in_stack_ffffffffffffff0c,
                                                                in_stack_ffffffffffffff08)))));
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x99a4f7);
    if ((bVar1) && (piVar4 = std::optional<int>::operator*((optional<int> *)0x99a50a), 0 < *piVar4))
    {
      piVar4 = std::optional<int>::operator*((optional<int> *)0x99a54c);
      *in_RDX = *piVar4;
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RSI,0);
      pTVar5 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x99a575);
      local_84 = 0;
      while( true ) {
        iVar7 = local_84;
        piVar4 = std::optional<int>::operator*((optional<int> *)0x99a5ac);
        code = SUB84((ulong)pTVar5 >> 0x20,0);
        if (*piVar4 + -1 <= iVar7) break;
        in_stack_ffffffffffffff1b = Type::isArray(in_stack_fffffffffffffee8);
        if (!(bool)in_stack_ffffffffffffff1b) {
          local_1 = checkDim::anon_class_24_3_8c0f11e8::operator()
                              ((anon_class_24_3_8c0f11e8 *)in_stack_ffffffffffffff10);
          goto LAB_0099a7eb;
        }
        in_stack_ffffffffffffff10 = Type::getArrayElementType(in_stack_fffffffffffffef8);
        local_84 = local_84 + 1;
      }
      uVar2 = Type::hasFixedRange((Type *)in_stack_fffffffffffffef0);
      if ((!(bool)uVar2) ||
         (in_stack_ffffffffffffff0e = Type::isScalar((Type *)0x99a66e),
         (bool)in_stack_ffffffffffffff0e)) {
        uVar3 = Type::isString((Type *)0x99a6a3);
        if (((bool)uVar3) ||
           (in_stack_ffffffffffffff0c = Type::isUnpackedArray(in_stack_fffffffffffffee8),
           (bool)in_stack_ffffffffffffff0c)) {
          piVar4 = std::optional<int>::operator*((optional<int> *)0x99a70d);
          if (*piVar4 == 1) {
            local_1 = true;
          }
          else {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RSI,0);
            sourceRange.endLoc._0_2_ = in_stack_ffffffffffffff18;
            sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff10;
            sourceRange.endLoc._2_1_ = in_stack_ffffffffffffff1a;
            sourceRange.endLoc._3_1_ = in_stack_ffffffffffffff1b;
            sourceRange.endLoc._4_4_ = iVar7;
            SVar6 = (SourceLocation)
                    ASTContext::addDiag((ASTContext *)
                                        CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff0e,
                                                                CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)))),code,sourceRange);
            this = Diagnostic::operator<<
                             (in_stack_fffffffffffffef0,(ConstantValue *)in_stack_fffffffffffffee8);
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RSI,1);
            range.endLoc = SVar6;
            range.startLoc = in_RDI;
            Diagnostic::operator<<(this,range);
            local_1 = false;
          }
        }
        else {
          local_1 = checkDim::anon_class_24_3_8c0f11e8::operator()
                              ((anon_class_24_3_8c0f11e8 *)in_stack_ffffffffffffff10);
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = checkDim::anon_class_24_3_8c0f11e8::operator()
                          ((anon_class_24_3_8c0f11e8 *)in_stack_ffffffffffffff10);
    }
  }
  else {
    local_1 = true;
  }
LAB_0099a7eb:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x99a7f8);
  return local_1;
}

Assistant:

static bool checkDim(const ASTContext& context, const Args& args, int32_t& resultIndex) {
        // Similar logic to what's above, except we're just verifying a constant index here.
        // It's ok for it not to be constant, it will be evaluated at runtime.
        ConstantValue iv = context.tryEval(*args[1]);
        if (!iv)
            return true;

        auto error = [&] {
            context.addDiag(diag::DimensionIndexInvalid, args[1]->sourceRange)
                << iv << *args[0]->type;
            return false;
        };

        std::optional<int32_t> index = iv.integer().as<int32_t>();
        if (!index || *index <= 0)
            return error();

        resultIndex = *index;
        const Type* type = args[0]->type;
        for (int32_t i = 0; i < *index - 1; i++) {
            if (!type->isArray())
                return error();
            type = type->getArrayElementType();
        }

        if (type->hasFixedRange() && !type->isScalar())
            return true;

        if (!type->isString() && !type->isUnpackedArray())
            return error();

        if (*index != 1) {
            context.addDiag(diag::DynamicDimensionIndex, args[0]->sourceRange)
                << iv << args[1]->sourceRange;
            return false;
        }

        return true;
    }